

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xbox.cpp
# Opt level: O0

void rw::xbox::defaultUninstanceCB(Geometry *geo,InstanceDataHeader *header)

{
  uint uVar1;
  uint uVar2;
  uint32 *puVar3;
  uint local_44;
  uint local_40;
  uint local_3c;
  int local_38;
  int i;
  uint32 sel;
  uint8 *src;
  uint32 fmt;
  uint32 *vertexFmt;
  InstanceDataHeader *header_local;
  Geometry *geo_local;
  
  puVar3 = getVertexFmt(geo);
  uVar1 = *puVar3;
  _i = (uint8 *)header->vertexBuffer;
  uVar2 = uVar1 & 0xf;
  uninstV3d(*(int *)(v3dFormatMap + (ulong)uVar2 * 4),geo->morphTargets->vertices,_i,
            header->numVertices,header->stride);
  if (uVar2 == 4) {
    local_3c = 4;
  }
  else {
    local_3c = *(int *)(vertexFormatSizes + (ulong)uVar2 * 4) * 3;
  }
  _i = _i + local_3c;
  uVar2 = uVar1 >> 4 & 0xf;
  if (uVar2 != 0) {
    uninstV3d(*(int *)(v3dFormatMap + (ulong)uVar2 * 4),geo->morphTargets->normals,_i,
              header->numVertices,header->stride);
    if (uVar2 == 4) {
      local_40 = 4;
    }
    else {
      local_40 = *(int *)(vertexFormatSizes + (ulong)uVar2 * 4) * 3;
    }
    _i = _i + local_40;
  }
  if ((uVar1 & 0x1000000) != 0) {
    uninstColor(10,geo->colors,_i,header->numVertices,header->stride);
    _i = _i + 4;
  }
  local_38 = 0;
  while ((local_38 < 4 && (uVar2 = uVar1 >> ((char)(local_38 << 2) + 8U & 0x1f) & 0xf, uVar2 != 0)))
  {
    uninstTexCoords(*(int *)(v2dFormatMap + (ulong)uVar2 * 4),geo->texCoords[local_38],_i,
                    header->numVertices,header->stride);
    if (uVar2 == 4) {
      local_44 = 4;
    }
    else {
      local_44 = *(int *)(vertexFormatSizes + (ulong)uVar2 * 4) << 1;
    }
    _i = _i + local_44;
    local_38 = local_38 + 1;
  }
  return;
}

Assistant:

void
defaultUninstanceCB(Geometry *geo, InstanceDataHeader *header)
{
	uint32 *vertexFmt = getVertexFmt(geo);
	uint32 fmt = *vertexFmt;
	assert(fmt != 0);
	uint8 *src = (uint8*)header->vertexBuffer;

	uint32 sel = fmt & 0xF;
	uninstV3d(v3dFormatMap[sel], geo->morphTargets[0].vertices, src,
	          header->numVertices, header->stride);
	src += sel == 4 ? 4 : 3*vertexFormatSizes[sel];

	sel = (fmt >> 4) & 0xF;
	if(sel){
		uninstV3d(v3dFormatMap[sel], geo->morphTargets[0].normals, src,
		          header->numVertices, header->stride);
		src += sel == 4 ? 4 : 3*vertexFormatSizes[sel];
	}

	if(fmt & 0x1000000){
		uninstColor(VERT_ARGB, geo->colors, src,
		            header->numVertices, header->stride);
		src += 4;
	}

	for(int i = 0; i < 4; i++){
		sel = (fmt >> (i*4 + 8)) & 0xF;
		if(sel == 0)
			break;
		uninstTexCoords(v2dFormatMap[sel], geo->texCoords[i], src,
		          header->numVertices, header->stride);
		src += sel == 4 ? 4 : 2*vertexFormatSizes[sel];
	}
}